

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedTimeZone::getOffset
          (RuleBasedTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,
          uint8_t param_5,int32_t millis,int32_t param_7,UErrorCode *status)

{
  UBool UVar1;
  double dVar2;
  UDate time;
  int local_30;
  int32_t dstOffset;
  int32_t rawOffset;
  int32_t iStack_24;
  uint8_t param_5_local;
  int32_t day_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  RuleBasedTimeZone *this_local;
  
  dstOffset._3_1_ = param_5;
  rawOffset = day;
  iStack_24 = month;
  day_local = year;
  month_local._3_1_ = era;
  _year_local = this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (month_local._3_1_ == '\0') {
      day_local = 1 - day_local;
    }
    dVar2 = Grego::fieldsToDay(day_local,iStack_24,rawOffset);
    getOffsetInternal(this,dVar2 * 86400000.0 + (double)millis,'\x01',3,1,&local_30,
                      (int32_t *)((long)&time + 4),status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      this_local._4_4_ = local_30 + time._4_4_;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                             uint8_t /*dayOfWeek*/, int32_t millis,
                             int32_t /*monthLength*/, UErrorCode& status) const {
    // dayOfWeek and monthLength are unused
    if (U_FAILURE(status)) {
        return 0;
    }
    if (era == GregorianCalendar::BC) {
        // Convert to extended year
        year = 1 - year;
    }
    int32_t rawOffset, dstOffset;
    UDate time = (UDate)Grego::fieldsToDay(year, month, day) * U_MILLIS_PER_DAY + millis;
    getOffsetInternal(time, TRUE, kDaylight, kStandard, rawOffset, dstOffset, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    return (rawOffset + dstOffset);
}